

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

str pybind11::detail::enum_name(handle arg)

{
  bool bVar1;
  long in_RSI;
  object in_RDI;
  dict entries;
  dict_iterator __begin2;
  object local_b0;
  handle local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  object_api<pybind11::handle> local_90 [8];
  handle local_88;
  PyObject *apPStack_80 [2];
  dict_readonly local_70;
  item_accessor local_50;
  
  local_70.key = *(PyObject **)(in_RSI + 8);
  local_70.value = (PyObject *)0x20cf29;
  local_70.pos = 0;
  dict::dict<pybind11::detail::accessor_policies::str_attr>
            ((dict *)&local_b0,(accessor<pybind11::detail::accessor_policies::str_attr> *)&local_70)
  ;
  object::~object((object *)&local_70.pos);
  dict::begin((dict_iterator *)&local_70,(dict *)&local_b0);
  do {
    if (local_70.pos == -1) {
      str::str((str *)in_RDI.super_handle.m_ptr,"???");
LAB_001c97cd:
      object::~object(&local_b0);
      return (str)in_RDI.super_handle.m_ptr;
    }
    local_88.m_ptr = local_70.key;
    apPStack_80[0] = local_70.value;
    int_::int_<int,_0>((int_ *)&local_a8,0);
    object_api<pybind11::handle>::operator[]
              (&local_50,(object_api<pybind11::handle> *)apPStack_80,local_a8);
    accessor::operator_cast_to_object((accessor *)&local_a0);
    local_98 = local_a0;
    bVar1 = object_api<pybind11::handle>::equal((object_api<pybind11::handle> *)&local_98,local_90);
    object::~object((object *)&local_a0);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_50);
    object::~object((object *)&local_a8);
    if (bVar1) {
      str::str((str *)in_RDI.super_handle.m_ptr,local_88);
      goto LAB_001c97cd;
    }
    iterator_policies::dict_readonly::increment(&local_70);
  } while( true );
}

Assistant:

inline str enum_name(handle arg) {
    dict entries = arg.get_type().attr("__entries");
    for (auto kv : entries) {
        if (handle(kv.second[int_(0)]).equal(arg))
            return pybind11::str(kv.first);
    }
    return "???";
}